

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

void __thiscall kratos::FSMState::FSMState(FSMState *this,string *name,FSM *parent)

{
  FSM *parent_local;
  string *name_local;
  FSMState *this_local;
  
  std::enable_shared_from_this<kratos::FSMState>::enable_shared_from_this
            (&this->super_enable_shared_from_this<kratos::FSMState>);
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  this->parent_ = parent;
  std::
  vector<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
  ::vector(&this->transitions_);
  std::
  map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  ::map(&this->output_values_);
  std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::vector(&this->output_ordering_);
  std::
  unordered_map<kratos::FSMState_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  ::unordered_map(&this->next_state_fn_ln_);
  std::
  unordered_map<kratos::Var_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  ::unordered_map(&this->output_fn_ln_);
  return;
}

Assistant:

FSMState::FSMState(std::string name, FSM* parent) : name_(std::move(name)), parent_(parent) {}